

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

void __thiscall chrono::utils::ChISO2631_1_Wk::Config(ChISO2631_1_Wk *this,double step)

{
  ChButterworth_Highpass::Config(&this->hp,2,step,0.4);
  ChButterworth_Lowpass::Config(&this->lp,2,step,100.0);
  ChISO2631_1_AVTransition::Config(&this->avt,step,12.5,12.5,0.63);
  ChISO2631_1_UpwardStep::Config(&this->ups,step,2.37,3.35,0.91,0.91);
  Reset(this);
  return;
}

Assistant:

void ChISO2631_1_Wk::Config(double step) {
    hp.Config(2, step, f1);
    lp.Config(2, step, f2);
    avt.Config(step, f3, f4, Q4);
    ups.Config(step, f5, f6, Q5, Q6);

    Reset();
}